

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCSat2.c
# Opt level: O0

void Cbs2_ObjCreateFanout(Cbs2_Man_t *p,int iObj,int iFan0,int iFan1)

{
  int iVar1;
  int iVar2;
  int iFan1_local;
  int iFan0_local;
  int iObj_local;
  Cbs2_Man_t *p_local;
  
  iVar1 = Abc_Var2Lit(iObj,0);
  iVar2 = Vec_IntEntry(&p->vFanout0,iFan0);
  Vec_IntWriteEntry(&p->vFanoutN,iVar1,iVar2);
  iVar1 = Abc_Var2Lit(iObj,1);
  iVar2 = Vec_IntEntry(&p->vFanout0,iFan1);
  Vec_IntWriteEntry(&p->vFanoutN,iVar1,iVar2);
  iVar1 = Abc_Var2Lit(iObj,0);
  Vec_IntWriteEntry(&p->vFanout0,iFan0,iVar1);
  iVar1 = Abc_Var2Lit(iObj,1);
  Vec_IntWriteEntry(&p->vFanout0,iFan1,iVar1);
  return;
}

Assistant:

void Cbs2_ObjCreateFanout( Cbs2_Man_t * p, int iObj, int iFan0, int iFan1 )
{
    Vec_IntWriteEntry( &p->vFanoutN, Abc_Var2Lit(iObj, 0), Vec_IntEntry(&p->vFanout0, iFan0) );
    Vec_IntWriteEntry( &p->vFanoutN, Abc_Var2Lit(iObj, 1), Vec_IntEntry(&p->vFanout0, iFan1) );
    Vec_IntWriteEntry( &p->vFanout0, iFan0, Abc_Var2Lit(iObj, 0) );
    Vec_IntWriteEntry( &p->vFanout0, iFan1, Abc_Var2Lit(iObj, 1) );
}